

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O2

int __thiscall cmCPackIFWGenerator::PackageFiles(cmCPackIFWGenerator *this)

{
  string *psVar1;
  cmCPackLog *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  bool bVar3;
  ostream *poVar4;
  char *pcVar5;
  pointer pbVar6;
  _Rb_tree_node_base *p_Var7;
  _Base_ptr p_Var8;
  uint uVar9;
  iterator it_1;
  pointer pbVar10;
  iterator it;
  bool bVar11;
  int retVal;
  string ifwCmd;
  string output;
  string ifwTmpFile;
  char *local_430 [4];
  ostringstream cmCPackLog_msg_3;
  ostringstream cmCPackLog_msg;
  string ifwTLD;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
  poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"- Configuration");
  std::endl<char,std::char_traits<char>>(poVar4);
  pcVar2 = (this->super_cmCPackGenerator).Logger;
  std::__cxx11::stringbuf::str();
  cmCPackLog::Log(pcVar2,1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                  ,0x45,_cmCPackLog_msg_3);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg_3);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
  cmCPackIFWInstaller::GenerateInstallerFile(&this->Installer);
  cmCPackIFWInstaller::GeneratePackageFiles(&this->Installer);
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_TOPLEVEL_DIRECTORY",(allocator *)&cmCPackLog_msg_3);
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
  std::__cxx11::string::string((string *)&ifwTLD,pcVar5,(allocator *)&ifwTmpFile);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  std::__cxx11::string::string((string *)&ifwTmpFile,(string *)&ifwTLD);
  std::__cxx11::string::append((char *)&ifwTmpFile);
  if ((this->Installer).Repositories.
      super__Vector_base<cmCPackIFWInstaller::RepositoryStruct,_std::allocator<cmCPackIFWInstaller::RepositoryStruct>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->Installer).Repositories.
      super__Vector_base<cmCPackIFWInstaller::RepositoryStruct,_std::allocator<cmCPackIFWInstaller::RepositoryStruct>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string((string *)&ifwCmd,(string *)&this->RepoGen);
    bVar3 = IsVersionLess(this,"2.0.0");
    if (bVar3) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &cmCPackLog_msg_3," -c ",&(this->super_cmCPackGenerator).toplevel);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &cmCPackLog_msg,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &cmCPackLog_msg_3,"/config/config.xml");
      std::__cxx11::string::append((string *)&ifwCmd);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg_3);
    }
    psVar1 = &(this->super_cmCPackGenerator).toplevel;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCPackLog_msg_3," -p ",psVar1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCPackLog_msg,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCPackLog_msg_3,"/packages");
    std::__cxx11::string::append((string *)&ifwCmd);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg_3);
    pbVar10 = (this->PkgsDirsVector).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar6 = (this->PkgsDirsVector).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar10 != pbVar6) {
      for (; pbVar10 != pbVar6; pbVar10 = pbVar10 + 1) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &cmCPackLog_msg," -p ",pbVar10);
        std::__cxx11::string::append((string *)&ifwCmd);
        std::__cxx11::string::~string((string *)&cmCPackLog_msg);
        pbVar6 = (this->PkgsDirsVector).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
    }
    if ((this->OnlineOnly == false) &&
       ((this->DownloadedPackages)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
      std::__cxx11::string::append((char *)&ifwCmd);
      p_Var7 = (this->DownloadedPackages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      std::__cxx11::string::append((string *)&ifwCmd);
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
      for (; (_Rb_tree_header *)p_Var7 !=
             &(this->DownloadedPackages)._M_t._M_impl.super__Rb_tree_header;
          p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &cmCPackLog_msg,",",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (*(long *)(p_Var7 + 1) + 0x80));
        std::__cxx11::string::append((string *)&ifwCmd);
        std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      }
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCPackLog_msg_3," ",psVar1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCPackLog_msg,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCPackLog_msg_3,"/repository");
    std::__cxx11::string::append((string *)&ifwCmd);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg_3);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"Execute: ");
    poVar4 = std::operator<<(poVar4,(string *)&ifwCmd);
    std::endl<char,std::char_traits<char>>(poVar4);
    pcVar2 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar2,2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                    ,0x75,_cmCPackLog_msg_3);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg_3);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    output._M_dataplus._M_p = (pointer)&output.field_2;
    output._M_string_length = 0;
    output.field_2._M_local_buf[0] = '\0';
    retVal = 1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"- Generate repository");
    std::endl<char,std::char_traits<char>>(poVar4);
    pcVar2 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar2,1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                    ,0x79,_cmCPackLog_msg_3);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg_3);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    bVar3 = cmSystemTools::RunSingleCommand
                      (ifwCmd._M_dataplus._M_p,&output,&output,&retVal,(char *)0x0,
                       (this->super_cmCPackGenerator).GeneratorVerbose,0.0);
    bVar11 = retVal != 0;
    if (!bVar3 || bVar11) {
      cmGeneratedFileStream::cmGeneratedFileStream
                ((cmGeneratedFileStream *)&cmCPackLog_msg,ifwTmpFile._M_dataplus._M_p,false);
      poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"# Run command: ");
      poVar4 = std::operator<<(poVar4,(string *)&ifwCmd);
      poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<(poVar4,"# Output:");
      poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<(poVar4,(string *)&output);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg_3);
      poVar4 = std::operator<<((ostream *)&cmCPackLog_msg_3,"Problem running IFW command: ");
      poVar4 = std::operator<<(poVar4,(string *)&ifwCmd);
      poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<(poVar4,"Please check ");
      poVar4 = std::operator<<(poVar4,(string *)&ifwTmpFile);
      poVar4 = std::operator<<(poVar4," for errors");
      std::endl<char,std::char_traits<char>>(poVar4);
      pcVar2 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar2,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                      ,0x86,local_430[0]);
      std::__cxx11::string::~string((string *)local_430);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg_3);
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&cmCPackLog_msg);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
      poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"- repository: ");
      poVar4 = std::operator<<(poVar4,(string *)psVar1);
      poVar4 = std::operator<<(poVar4,"/repository generated");
      std::endl<char,std::char_traits<char>>(poVar4);
      pcVar2 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar2,1,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                      ,0x8a,_cmCPackLog_msg_3);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg_3);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    }
    std::__cxx11::string::~string((string *)&output);
    std::__cxx11::string::~string((string *)&ifwCmd);
    uVar9 = 0;
    if (!bVar3 || bVar11) goto LAB_00288d4b;
  }
  std::__cxx11::string::string((string *)&ifwCmd,(string *)&this->BinCreator);
  psVar1 = &(this->super_cmCPackGenerator).toplevel;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &cmCPackLog_msg_3," -c ",psVar1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &cmCPackLog_msg,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &cmCPackLog_msg_3,"/config/config.xml");
  std::__cxx11::string::append((string *)&ifwCmd);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg_3);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &cmCPackLog_msg_3," -p ",psVar1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &cmCPackLog_msg,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &cmCPackLog_msg_3,"/packages");
  std::__cxx11::string::append((string *)&ifwCmd);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg_3);
  pbVar10 = (this->PkgsDirsVector).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar6 = (this->PkgsDirsVector).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar10 != pbVar6) {
    for (; pbVar10 != pbVar6; pbVar10 = pbVar10 + 1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &cmCPackLog_msg," -p ",pbVar10);
      std::__cxx11::string::append((string *)&ifwCmd);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      pbVar6 = (this->PkgsDirsVector).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
  }
  if (this->OnlineOnly == true) {
    std::__cxx11::string::append((char *)&ifwCmd);
  }
  else if (((this->DownloadedPackages)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
          ((this->Installer).Repositories.
           super__Vector_base<cmCPackIFWInstaller::RepositoryStruct,_std::allocator<cmCPackIFWInstaller::RepositoryStruct>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           (this->Installer).Repositories.
           super__Vector_base<cmCPackIFWInstaller::RepositoryStruct,_std::allocator<cmCPackIFWInstaller::RepositoryStruct>_>
           ._M_impl.super__Vector_impl_data._M_finish)) {
    if ((this->DependentPackages)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      std::__cxx11::string::append((char *)&ifwCmd);
      for (p_Var8 = (this->BinaryPackages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var8 != &(this->BinaryPackages)._M_t._M_impl.super__Rb_tree_header;
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &cmCPackLog_msg,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (*(long *)(p_Var8 + 1) + 0x80),",");
        std::__cxx11::string::append((string *)&ifwCmd);
        std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      }
      p_Var7 = (this->DependentPackages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      std::__cxx11::string::append((string *)&ifwCmd);
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
      for (; (_Rb_tree_header *)p_Var7 !=
             &(this->DependentPackages)._M_t._M_impl.super__Rb_tree_header;
          p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &cmCPackLog_msg,",",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var7 + 2));
        std::__cxx11::string::append((string *)&ifwCmd);
        std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      }
    }
  }
  else {
    std::__cxx11::string::append((char *)&ifwCmd);
    p_Var7 = (this->DownloadedPackages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::string::append((string *)&ifwCmd);
    p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
    for (; (_Rb_tree_header *)p_Var7 !=
           &(this->DownloadedPackages)._M_t._M_impl.super__Rb_tree_header;
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &cmCPackLog_msg,",",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (*(long *)(p_Var7 + 1) + 0x80));
      std::__cxx11::string::append((string *)&ifwCmd);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    }
  }
  __rhs = (this->super_cmCPackGenerator).packageFileNames.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  if ((this->super_cmCPackGenerator).packageFileNames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == __rhs) {
    std::__cxx11::string::append((char *)&ifwCmd);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCPackLog_msg," ",__rhs);
    std::__cxx11::string::append((string *)&ifwCmd);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
  poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"Execute: ");
  poVar4 = std::operator<<(poVar4,(string *)&ifwCmd);
  std::endl<char,std::char_traits<char>>(poVar4);
  pcVar2 = (this->super_cmCPackGenerator).Logger;
  std::__cxx11::stringbuf::str();
  cmCPackLog::Log(pcVar2,2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                  ,0xcb,_cmCPackLog_msg_3);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg_3);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
  output._M_dataplus._M_p = (pointer)&output.field_2;
  output._M_string_length = 0;
  output.field_2._M_local_buf[0] = '\0';
  retVal = 1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
  poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"- Generate package");
  std::endl<char,std::char_traits<char>>(poVar4);
  pcVar2 = (this->super_cmCPackGenerator).Logger;
  std::__cxx11::stringbuf::str();
  cmCPackLog::Log(pcVar2,1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                  ,0xce,_cmCPackLog_msg_3);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg_3);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
  bVar3 = cmSystemTools::RunSingleCommand
                    (ifwCmd._M_dataplus._M_p,&output,&output,&retVal,(char *)0x0,
                     (this->super_cmCPackGenerator).GeneratorVerbose,0.0);
  bVar11 = retVal == 0;
  if (!bVar3 || !bVar11) {
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)&cmCPackLog_msg,ifwTmpFile._M_dataplus._M_p,false);
    poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"# Run command: ");
    poVar4 = std::operator<<(poVar4,(string *)&ifwCmd);
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<(poVar4,"# Output:");
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<(poVar4,(string *)&output);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg_3);
    poVar4 = std::operator<<((ostream *)&cmCPackLog_msg_3,"Problem running IFW command: ");
    poVar4 = std::operator<<(poVar4,(string *)&ifwCmd);
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<(poVar4,"Please check ");
    poVar4 = std::operator<<(poVar4,(string *)&ifwTmpFile);
    poVar4 = std::operator<<(poVar4," for errors");
    std::endl<char,std::char_traits<char>>(poVar4);
    pcVar2 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar2,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                    ,0xdb,local_430[0]);
    std::__cxx11::string::~string((string *)local_430);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg_3);
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&cmCPackLog_msg);
  }
  std::__cxx11::string::~string((string *)&output);
  std::__cxx11::string::~string((string *)&ifwCmd);
  uVar9 = (uint)(bVar3 && bVar11);
LAB_00288d4b:
  std::__cxx11::string::~string((string *)&ifwTmpFile);
  std::__cxx11::string::~string((string *)&ifwTLD);
  return uVar9;
}

Assistant:

int cmCPackIFWGenerator::PackageFiles()
{
  cmCPackLogger(cmCPackLog::LOG_OUTPUT, "- Configuration" << std::endl);

  // Installer configuragion
  Installer.GenerateInstallerFile();

  // Packages configuration
  Installer.GeneratePackageFiles();

  std::string ifwTLD = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
  std::string ifwTmpFile = ifwTLD;
  ifwTmpFile += "/IFWOutput.log";

  // Run repogen
  if (!Installer.Repositories.empty())
    {
    std::string ifwCmd = RepoGen;

    if(IsVersionLess("2.0.0"))
      {
      ifwCmd += " -c " + this->toplevel + "/config/config.xml";
      }

    ifwCmd += " -p " + this->toplevel + "/packages";

    if(!PkgsDirsVector.empty())
      {
      for(std::vector<std::string>::iterator it = PkgsDirsVector.begin();
          it != PkgsDirsVector.end(); ++it)
        {
        ifwCmd += " -p " + *it;
        }
      }

    if (!OnlineOnly && !DownloadedPackages.empty())
      {
      ifwCmd += " -i ";
      std::set<cmCPackIFWPackage*>::iterator it
        = DownloadedPackages.begin();
      ifwCmd += (*it)->Name;
      ++it;
      while(it != DownloadedPackages.end())
        {
        ifwCmd += "," + (*it)->Name;
        ++it;
        }
      }
    ifwCmd += " " + this->toplevel + "/repository";
    cmCPackLogger(cmCPackLog::LOG_VERBOSE, "Execute: " << ifwCmd
                  << std::endl);
    std::string output;
    int retVal = 1;
    cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                  "- Generate repository" << std::endl);
    bool res = cmSystemTools::RunSingleCommand(
      ifwCmd.c_str(), &output, &output,
      &retVal, 0, this->GeneratorVerbose, 0);
    if ( !res || retVal )
      {
      cmGeneratedFileStream ofs(ifwTmpFile.c_str());
      ofs << "# Run command: " << ifwCmd << std::endl
          << "# Output:" << std::endl
          << output << std::endl;
      cmCPackLogger(cmCPackLog::LOG_ERROR, "Problem running IFW command: "
                    << ifwCmd << std::endl
                    << "Please check " << ifwTmpFile << " for errors"
                    << std::endl);
      return 0;
      }
    cmCPackLogger(cmCPackLog::LOG_OUTPUT, "- repository: " << this->toplevel
                  << "/repository generated" << std::endl);
    }

  // Run binary creator
  {
  std::string ifwCmd = BinCreator;
  ifwCmd += " -c " + this->toplevel + "/config/config.xml";
  ifwCmd += " -p " + this->toplevel + "/packages";

  if(!PkgsDirsVector.empty())
    {
    for(std::vector<std::string>::iterator it = PkgsDirsVector.begin();
        it != PkgsDirsVector.end(); ++it)
      {
      ifwCmd += " -p " + *it;
      }
    }

  if (OnlineOnly)
    {
    ifwCmd += " --online-only";
    }
  else if (!DownloadedPackages.empty() && !Installer.Repositories.empty())
    {
    ifwCmd += " -e ";
    std::set<cmCPackIFWPackage*>::iterator it
      = DownloadedPackages.begin();
    ifwCmd += (*it)->Name;
    ++it;
    while(it != DownloadedPackages.end())
      {
      ifwCmd += "," + (*it)->Name;
      ++it;
      }
    }
  else if (!DependentPackages.empty())
    {
    ifwCmd += " -i ";
    // Binary
    std::set<cmCPackIFWPackage*>::iterator bit = BinaryPackages.begin();
    while(bit != BinaryPackages.end())
      {
      ifwCmd += (*bit)->Name + ",";
      ++bit;
      }
    // Depend
    DependenceMap::iterator it = DependentPackages.begin();
    ifwCmd += it->second.Name;
    ++it;
    while(it != DependentPackages.end())
      {
      ifwCmd += "," + it->second.Name;
      ++it;
      }
    }
  // TODO: set correct name for multipackages
  if (this->packageFileNames.size() > 0)
    {
    ifwCmd += " " + packageFileNames[0];
    }
  else
    {
    ifwCmd += " installer";
    }
  cmCPackLogger(cmCPackLog::LOG_VERBOSE, "Execute: " << ifwCmd
                << std::endl);
  std::string output;
  int retVal = 1;
  cmCPackLogger(cmCPackLog::LOG_OUTPUT, "- Generate package" << std::endl);
  bool res = cmSystemTools::RunSingleCommand(
    ifwCmd.c_str(), &output, &output,
    &retVal, 0, this->GeneratorVerbose, 0);
  if ( !res || retVal )
    {
    cmGeneratedFileStream ofs(ifwTmpFile.c_str());
    ofs << "# Run command: " << ifwCmd << std::endl
        << "# Output:" << std::endl
        << output << std::endl;
    cmCPackLogger(cmCPackLog::LOG_ERROR, "Problem running IFW command: "
                  << ifwCmd << std::endl
                  << "Please check " << ifwTmpFile << " for errors"
                  << std::endl);
    return 0;
    }
  }

  return 1;
}